

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

void ixgbe_set_promisc(ixy_device *ixy,_Bool enabled)

{
  byte bVar1;
  byte in_SIL;
  undefined8 in_RDI;
  ixy_device *__mptr;
  ixgbe_device *dev;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  if (bVar1 == 0) {
    fprintf(_stdout,"[INFO ] %s:%d %s(): disabling promisc mode\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
            0x274,"ixgbe_set_promisc");
    clear_flags32((uint8_t *)CONCAT17(bVar1,in_stack_fffffffffffffff0),(int)((ulong)in_RDI >> 0x20),
                  (uint32_t)in_RDI);
  }
  else {
    fprintf(_stdout,"[INFO ] %s:%d %s(): enabling promisc mode\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
            0x271,"ixgbe_set_promisc");
    set_flags32((uint8_t *)CONCAT17(bVar1,in_stack_fffffffffffffff0),(int)((ulong)in_RDI >> 0x20),
                (uint32_t)in_RDI);
  }
  return;
}

Assistant:

void ixgbe_set_promisc(struct ixy_device* ixy, bool enabled) {
	struct ixgbe_device* dev = IXY_TO_IXGBE(ixy);
	if (enabled) {
		info("enabling promisc mode");
		set_flags32(dev->addr, IXGBE_FCTRL, IXGBE_FCTRL_MPE | IXGBE_FCTRL_UPE);
	} else {
		info("disabling promisc mode");
		clear_flags32(dev->addr, IXGBE_FCTRL, IXGBE_FCTRL_MPE | IXGBE_FCTRL_UPE);
	}
}